

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O1

bool tinyusdz::is_valid_utf8(string *str)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (str->_M_string_length <= uVar4) break;
    bVar1 = (str->_M_dataplus)._M_p[uVar4];
    uVar3 = 1;
    if ((char)bVar1 < '\0') {
      uVar3 = 2;
      if (((bVar1 & 0xe0) != 0xc0) && (uVar3 = 3, (bVar1 & 0xf0) != 0xe0)) {
        uVar3 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
      }
    }
    uVar2 = uVar3 + uVar4;
  } while (uVar3 != 0);
  return str->_M_string_length <= uVar4;
}

Assistant:

bool is_valid_utf8(const std::string &str) {
  // TODO: Consider UTF-BOM?
  for (size_t i = 0; i < str.size();) {
    uint32_t len = detail::utf8_len(*reinterpret_cast<const unsigned char *>(&str[i]));
    if (len == 0) {
      return false;
    }
    i += len;
  }
  return true;
}